

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.h
# Opt level: O2

void __thiscall basisu::basisu_backend_output::clear(basisu_backend_output *this)

{
  this->m_tex_format = cETC1S;
  this->m_etc1s = false;
  this->m_uses_global_codebooks = false;
  this->m_srgb = true;
  this->m_num_endpoints = 0;
  this->m_num_selectors = 0;
  vector<unsigned_char>::clear(&this->m_endpoint_palette);
  vector<unsigned_char>::clear(&this->m_selector_palette);
  vector<basisu::basisu_backend_slice_desc>::clear(&this->m_slice_desc);
  vector<unsigned_char>::clear(&this->m_slice_image_tables);
  vector<basisu::vector<unsigned_char>_>::clear(&this->m_slice_image_data);
  vector<unsigned_short>::clear(&this->m_slice_image_crcs);
  return;
}

Assistant:

void clear()
		{
			m_tex_format = basist::basis_tex_format::cETC1S;
			m_etc1s = false;
			m_uses_global_codebooks = false;
			m_srgb = true;

			m_num_endpoints = 0;
			m_num_selectors = 0;

			m_endpoint_palette.clear();
			m_selector_palette.clear();
			m_slice_desc.clear();
			m_slice_image_tables.clear();
			m_slice_image_data.clear();
			m_slice_image_crcs.clear();
		}